

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void Am_Call_Final_Do_And_Register
               (Am_Object *inter,Am_Object *command_obj,int x,int y,Am_Object *ref_obj,
               Am_Input_Char ic,Am_Object *object_modified,Am_Inter_Location *data,
               Am_Impl_Command_Setter *impl_command_setter)

{
  bool bVar1;
  Am_Inter_Location local_60;
  Am_Object local_58 [3];
  Am_Object local_40;
  Am_Object local_38;
  Am_Object *local_30;
  Am_Object *ref_obj_local;
  int y_local;
  int x_local;
  Am_Object *command_obj_local;
  Am_Object *inter_local;
  Am_Input_Char ic_local;
  
  local_30 = ref_obj;
  ref_obj_local._0_4_ = y;
  ref_obj_local._4_4_ = x;
  _y_local = command_obj;
  command_obj_local = inter;
  inter_local._4_4_ = ic;
  bVar1 = Am_Inter_Call_Both_Method
                    (inter,command_obj,0xca,x,y,ref_obj,(Am_Input_Char *)((long)&inter_local + 4),
                     object_modified,data);
  if (bVar1) {
    Am_Object::Am_Object(&local_38,inter);
    Am_Object::Am_Object(&local_40,command_obj);
    Am_Object::Am_Object(local_58,object_modified);
    Am_Inter_Location::Am_Inter_Location(&local_60,data);
    Am_Register_For_Undo(&local_38,&local_40,local_58,&local_60,impl_command_setter);
    Am_Inter_Location::~Am_Inter_Location(&local_60);
    Am_Object::~Am_Object(local_58);
    Am_Object::~Am_Object(&local_40);
    Am_Object::~Am_Object(&local_38);
  }
  return;
}

Assistant:

void
Am_Call_Final_Do_And_Register(Am_Object inter, Am_Object command_obj, int x,
                              int y, Am_Object ref_obj, Am_Input_Char ic,
                              Am_Object object_modified, Am_Inter_Location data,
                              Am_Impl_Command_Setter *impl_command_setter)
{
  if (Am_Inter_Call_Both_Method(inter, command_obj, Am_DO_METHOD, x, y, ref_obj,
                                ic, object_modified, data))
    Am_Register_For_Undo(inter, command_obj, object_modified, data,
                         impl_command_setter);
}